

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest_HostFunc_PingPong_Test::TestBody(InterpTest_HostFunc_PingPong_Test *this)

{
  initializer_list<wabt::interp::Value> __l;
  initializer_list<wabt::interp::Ref> __l_00;
  initializer_list<wabt::Type> __l_01;
  initializer_list<wabt::Type> __l_02;
  initializer_list<unsigned_char> __l_03;
  bool bVar1;
  HostFunc *this_00;
  DefinedFunc *this_01;
  char *pcVar2;
  reference this_02;
  AssertHelper local_2b0;
  Message local_2a8;
  u32 local_2a0;
  uint local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_2;
  Message local_280;
  size_type local_278;
  uint local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_250;
  Message local_248;
  Enum local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar;
  anon_union_16_6_113bff37_for_Value_0 local_220;
  anon_union_16_6_113bff37_for_Value_0 *local_210;
  size_type local_208;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_200;
  Ptr local_1e8;
  Result local_1cc;
  undefined1 local_1c8 [4];
  Result result;
  Ptr trap;
  Values results;
  Ref local_190;
  iterator local_188;
  size_type local_180;
  vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> local_178;
  anon_class_8_1_8991fb9c local_160;
  Callback local_158;
  allocator<wabt::Type> local_131;
  Type local_130;
  iterator local_128;
  size_type local_120;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_118;
  allocator<wabt::Type> local_f9;
  Type local_f8;
  iterator local_f0;
  size_type local_e8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_e0;
  FuncType local_c8;
  undefined1 local_88 [8];
  Ptr host_func;
  uchar local_68 [48];
  iterator local_38;
  size_type local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  InterpTest_HostFunc_PingPong_Test *local_10;
  InterpTest_HostFunc_PingPong_Test *this_local;
  
  local_10 = this;
  memcpy(local_68,&DAT_0030d593,0x30);
  local_38 = local_68;
  local_30 = 0x30;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)((long)&host_func.root_index_ + 7));
  __l_03._M_len = local_30;
  __l_03._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,__l_03,(allocator_type *)((long)&host_func.root_index_ + 7));
  InterpTest::ReadModule(&this->super_InterpTest,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&host_func.root_index_ + 7));
  wabt::Type::Type(&local_f8,I32);
  local_f0 = &local_f8;
  local_e8 = 1;
  std::allocator<wabt::Type>::allocator(&local_f9);
  __l_02._M_len = local_e8;
  __l_02._M_array = local_f0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_e0,__l_02,&local_f9);
  wabt::Type::Type(&local_130,I32);
  local_128 = &local_130;
  local_120 = 1;
  std::allocator<wabt::Type>::allocator(&local_131);
  __l_01._M_len = local_120;
  __l_01._M_array = local_128;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_118,__l_01,&local_131);
  wabt::interp::FuncType::FuncType(&local_c8,&local_e0,&local_118);
  local_160.this = this;
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_HostFunc_PingPong_Test::TestBody()::__0,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&local_158,&local_160);
  wabt::interp::HostFunc::New((Ptr *)local_88,&(this->super_InterpTest).store_,&local_c8,&local_158)
  ;
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_158);
  wabt::interp::FuncType::~FuncType(&local_c8);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_118);
  std::allocator<wabt::Type>::~allocator(&local_131);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_e0);
  std::allocator<wabt::Type>::~allocator(&local_f9);
  this_00 = wabt::interp::RefPtr<wabt::interp::HostFunc>::operator->
                      ((RefPtr<wabt::interp::HostFunc> *)local_88);
  local_190 = wabt::interp::Object::self((Object *)this_00);
  local_188 = &local_190;
  local_180 = 1;
  std::allocator<wabt::interp::Ref>::allocator
            ((allocator<wabt::interp::Ref> *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __l_00._M_len = local_180;
  __l_00._M_array = local_188;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
            (&local_178,__l_00,
             (allocator_type *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  InterpTest::Instantiate(&this->super_InterpTest,&local_178);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector(&local_178);
  std::allocator<wabt::interp::Ref>::~allocator
            ((allocator<wabt::interp::Ref> *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)local_1c8);
  InterpTest::GetFuncExport(&local_1e8,&this->super_InterpTest,0);
  this_01 = wabt::interp::RefPtr<wabt::interp::DefinedFunc>::operator->(&local_1e8);
  local_220.v128_.v = (v128)wabt::interp::Value::Make(1);
  local_210 = &local_220;
  local_208 = 1;
  std::allocator<wabt::interp::Value>::allocator
            ((allocator<wabt::interp::Value> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  __l._M_len = local_208;
  __l._M_array = (iterator)local_210;
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            (&local_200,__l,
             (allocator_type *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_1cc = wabt::interp::Func::Call
                        (&this_01->super_Func,&(this->super_InterpTest).store_,&local_200,
                         (Values *)&trap.root_index_,(Ptr *)local_1c8,(Stream *)0x0);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_200);
  std::allocator<wabt::interp::Value>::~allocator
            ((allocator<wabt::interp::Value> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_1e8);
  local_23c = Ok;
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_238,"Result::Ok","result",&local_23c,&local_1cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x14d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message(&local_248);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_26c = 1;
    local_278 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                          ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                           &trap.root_index_);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_268,"1u","results.size()",&local_26c,&local_278);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar1) {
      testing::Message::Message(&local_280);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x14e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_280);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_280);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
    local_29c = 0xb;
    this_02 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                        ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                         &trap.root_index_,0);
    local_2a0 = wabt::interp::Value::Get<unsigned_int>(this_02);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_298,"11u","results[0].Get<u32>()",&local_29c,&local_2a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
    if (!bVar1) {
      testing::Message::Message(&local_2a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x14f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      testing::Message::~Message(&local_2a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)local_1c8);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_88);
  return;
}

Assistant:

TEST_F(InterpTest, HostFunc_PingPong) {
  // (import "" "f" (func $f (param i32) (result i32)))
  // (func (export "g") (param i32) (result i32)
  //   (call $f (i32.add (local.get 0) (i32.const 1))))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x06, 0x01, 0x60,
      0x01, 0x7f, 0x01, 0x7f, 0x02, 0x06, 0x01, 0x00, 0x01, 0x66, 0x00, 0x00,
      0x03, 0x02, 0x01, 0x00, 0x07, 0x05, 0x01, 0x01, 0x67, 0x00, 0x01, 0x0a,
      0x0b, 0x01, 0x09, 0x00, 0x20, 0x00, 0x41, 0x01, 0x6a, 0x10, 0x00, 0x0b,
  });

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [&](Thread& thread, const Values& params, Values& results,
                        Trap::Ptr* out_trap) -> Result {
                      auto val = params[0].Get<u32>();
                      if (val < 10) {
                        return GetFuncExport(0)->Call(
                            store_, {Value::Make(val * 2)}, results, out_trap);
                      }
                      results[0] = Value::Make(val);
                      return Result::Ok;
                    });

  Instantiate({host_func->self()});

  // Should produce the following calls:
  //  g(1) -> f(2) -> g(4) -> f(5) -> g(10) -> f(11) -> return 11

  Values results;
  Trap::Ptr trap;
  Result result =
      GetFuncExport(0)->Call(store_, {Value::Make(1)}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(11u, results[0].Get<u32>());
}